

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  byte *pbVar1;
  xmlChar xVar2;
  xmlParserInputState xVar3;
  getParameterEntitySAXFunc p_Var4;
  xmlGenericErrorFunc p_Var5;
  xmlParserInputPtr pxVar6;
  getEntitySAXFunc p_Var7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  xmlEntityType xVar11;
  xmlChar *pxVar12;
  int *piVar13;
  xmlGenericErrorFunc *pp_Var14;
  void **ppvVar15;
  xmlChar *pxVar16;
  xmlEntityPtr pxVar17;
  xmlChar *pxVar18;
  xmlBufferPtr pxVar19;
  xmlParserInputPtr input;
  xmlChar *pxVar20;
  char *pcVar21;
  byte *pbVar22;
  xmlChar *pxVar23;
  xmlParserErrors xVar24;
  undefined7 in_register_00000081;
  size_t sVar25;
  size_t sVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  ulong local_60;
  xmlBufferPtr local_58;
  xmlBufferPtr local_50;
  uint local_48;
  int l;
  uint local_40;
  uint local_3c;
  xmlBufferPtr local_38;
  
  pxVar20 = (xmlChar *)CONCAT71(in_register_00000081,end);
  if (-1 < len && (str != (xmlChar *)0x0 && ctxt != (xmlParserCtxtPtr)0x0)) {
    local_48 = what;
    if ((0x28 < ctxt->depth) && ((0x400 < (uint)ctxt->depth || ((ctxt->options & 0x80000U) == 0))))
    {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      return (xmlChar *)0x0;
    }
    pxVar12 = (xmlChar *)(*xmlMallocAtomic)(300);
    pxVar16 = (xmlChar *)0x0;
    if (pxVar12 != (xmlChar *)0x0) {
      local_38 = (xmlBufferPtr)(ulong)(uint)len;
      if (len != 0) {
        uVar9 = xmlStringCurrentChar(ctxt,str,&l);
        pxVar16 = (xmlChar *)(ulong)uVar9;
      }
      local_3c = (uint)end3;
      local_38 = (xmlBufferPtr)(str + (long)local_38);
      local_40 = (uint)end2;
      local_60 = 300;
      sVar26 = 0;
      do {
        uVar9 = (uint)pxVar16;
        if ((((uVar9 == local_3c) || (uVar9 == local_40)) || (uVar9 == 0)) ||
           ((uVar9 == end || (ctxt->instate == XML_PARSER_EOF)))) {
          pxVar12[sVar26] = '\0';
          return pxVar12;
        }
        pxVar18 = pxVar12;
        sVar25 = sVar26;
        if (uVar9 == 0x26) {
          if (*(byte *)((long)&((xmlBufferPtr)str)->content + 1) == 0x23) {
            if (*(byte *)&((xmlBufferPtr)str)->content == 0x26) {
              bVar8 = *(byte *)((long)&((xmlBufferPtr)str)->content + 2);
              if (bVar8 == 0x78) {
                pbVar22 = (byte *)((long)&((xmlBufferPtr)str)->content + 3);
                uVar9 = 0;
                while( true ) {
                  bVar8 = *pbVar22;
                  if (bVar8 == 0x3b) break;
                  if (9 < (byte)(bVar8 - 0x30)) {
                    if ((byte)(bVar8 + 0x9f) < 6) {
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x57;
                      goto LAB_00153ed5;
                    }
                    if ((byte)(bVar8 + 0xbf) < 6) {
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x37;
                      goto LAB_00153ed5;
                    }
                    xVar24 = XML_ERR_INVALID_HEX_CHARREF;
LAB_00154c58:
                    uVar9 = 0;
                    xmlFatalErr(ctxt,xVar24,(char *)0x0);
                    goto LAB_00154c66;
                  }
                  uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x30;
LAB_00153ed5:
                  if (0x10ffff < (int)uVar9) {
                    uVar9 = 0x110000;
                  }
                  pbVar22 = pbVar22 + 1;
                }
              }
              else {
                pbVar22 = (byte *)((long)&((xmlBufferPtr)str)->content + 2);
                uVar9 = 0;
                while (bVar8 != 0x3b) {
                  if (9 < (byte)(bVar8 - 0x30)) {
                    xVar24 = XML_ERR_INVALID_DEC_CHARREF;
                    goto LAB_00154c58;
                  }
                  uVar9 = ((uint)bVar8 + uVar9 * 10) - 0x30;
                  if (0x10ffff < (int)uVar9) {
                    uVar9 = 0x110000;
                  }
                  pbVar1 = pbVar22 + 1;
                  pbVar22 = pbVar22 + 1;
                  bVar8 = *pbVar1;
                }
              }
              if ((int)uVar9 < 0x110000) {
                if ((int)uVar9 < 0x100) {
                  if ((0x1f < (int)uVar9) ||
                     ((uVar9 < 0xe && ((0x2600U >> (uVar9 & 0x1f) & 1) != 0)))) {
LAB_00154194:
                    str = pbVar22 + 1;
                    iVar10 = xmlCopyCharMultiByte(pxVar12 + sVar26,uVar9);
                    sVar25 = sVar26 + (long)iVar10;
                    if (((long)iVar10 + sVar26 + 100 <= local_60) ||
                       ((uVar27 = local_60 * 2 + 100, local_60 <= uVar27 &&
                        (pxVar18 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar27), local_60 = uVar27,
                        pxVar18 != (xmlChar *)0x0)))) goto LAB_00154a71;
                    pxVar16 = (xmlChar *)0x0;
                    goto LAB_00154c1f;
                  }
                }
                else if (uVar9 - 0x10000 < 0xffffd800 || uVar9 - 0xe000 < 0x1ffe) goto LAB_00154194;
LAB_00154c66:
                pcVar21 = "xmlParseStringCharRef: invalid xmlChar value %d\n";
              }
              else {
                pcVar21 = "xmlParseStringCharRef: character reference out of bounds\n";
              }
              xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,pcVar21,uVar9);
            }
            else {
              xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
            }
            goto LAB_00154c7b;
          }
          if ((local_48 & 1) == 0) goto LAB_00153fb3;
          piVar13 = __xmlParserDebugEntities();
          if (*piVar13 != 0) {
            pp_Var14 = __xmlGenericError();
            p_Var5 = *pp_Var14;
            ppvVar15 = __xmlGenericErrorContext();
            (*p_Var5)(*ppvVar15,"String decoding Entity Reference: %.30s\n",str);
          }
          if (*(byte *)&((xmlBufferPtr)str)->content == 0x26) {
            local_58 = (xmlBufferPtr)((long)&((xmlBufferPtr)str)->content + 1);
            pxVar16 = xmlParseStringName(ctxt,(xmlChar **)&local_58);
            pxVar19 = local_58;
            if (pxVar16 == (xmlChar *)0x0) {
              xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringEntityRef: no name\n");
              pxVar17 = (xmlEntityPtr)0x0;
              str = (xmlChar *)local_58;
            }
            else if (*(byte *)&local_58->content == 0x3b) {
              local_50 = (xmlBufferPtr)((long)&local_58->content + 1);
              if (((ctxt->options & 0x100000) == 0) &&
                 (pxVar17 = xmlGetPredefinedEntity(pxVar16), pxVar17 != (xmlEntityPtr)0x0)) {
                (*xmlFree)(pxVar16);
                str = (xmlChar *)local_50;
              }
              else {
                ctxt->nbentities = ctxt->nbentities + 1;
                if (ctxt->sax == (_xmlSAXHandler *)0x0) {
LAB_001545be:
                  pxVar17 = (xmlEntityPtr)0x0;
                }
                else {
                  p_Var7 = ctxt->sax->getEntity;
                  if (((p_Var7 == (getEntitySAXFunc)0x0) ||
                      (pxVar17 = (*p_Var7)(ctxt->userData,pxVar16), pxVar17 == (xmlEntityPtr)0x0))
                     && (((ctxt->options & 0x100000) == 0 ||
                         (pxVar17 = xmlGetPredefinedEntity(pxVar16), pxVar17 == (xmlEntityPtr)0x0)))
                     ) {
                    if ((xmlParserCtxtPtr)ctxt->userData != ctxt) goto LAB_001545be;
                    pxVar17 = xmlSAX2GetEntity(ctxt,pxVar16);
                  }
                }
                xVar3 = ctxt->instate;
                if (xVar3 == XML_PARSER_EOF) {
                  (*xmlFree)(pxVar16);
                  pxVar17 = (xmlEntityPtr)0x0;
                }
                else {
                  if (pxVar17 == (xmlEntityPtr)0x0) {
                    if ((ctxt->standalone == 1) ||
                       ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                      xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n"
                                        ,pxVar16);
                    }
                    else {
                      xmlErrMsgStr(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",
                                   pxVar16);
                    }
                    xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                    str = (xmlChar *)local_50;
                  }
                  else {
                    xVar11 = pxVar17->etype;
                    if (xVar11 == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
                      xmlFatalErrMsgStr(ctxt,XML_ERR_UNPARSED_ENTITY,
                                        "Entity reference to unparsed entity %s\n",pxVar16);
                      str = (xmlChar *)local_50;
                    }
                    else {
                      str = (xmlChar *)local_50;
                      if ((xVar3 == XML_PARSER_ATTRIBUTE_VALUE) &&
                         (xVar11 == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
                        xVar24 = XML_ERR_ENTITY_IS_EXTERNAL;
                        pcVar21 = "Attribute references external entity \'%s\'\n";
                      }
                      else {
                        if ((xVar3 == XML_PARSER_ATTRIBUTE_VALUE) &&
                           (xVar11 != XML_INTERNAL_PREDEFINED_ENTITY &&
                            pxVar17->content != (xmlChar *)0x0)) {
                          pxVar23 = xmlStrchr(pxVar17->content,'<');
                          if (pxVar23 != (xmlChar *)0x0) {
                            xVar24 = XML_ERR_LT_IN_ATTRIBUTE;
                            pcVar21 = "\'<\' in entity \'%s\' is not allowed in attributes values\n"
                            ;
                            goto LAB_00154993;
                          }
                          xVar11 = pxVar17->etype;
                        }
                        if ((xVar11 & ~XML_INTERNAL_GENERAL_ENTITY) != XML_INTERNAL_PARAMETER_ENTITY
                           ) goto LAB_0015499b;
                        xVar24 = XML_ERR_ENTITY_IS_PARAMETER;
                        pcVar21 = "Attempt to reference the parameter entity \'%s\'\n";
                      }
LAB_00154993:
                      xmlFatalErrMsgStr(ctxt,xVar24,pcVar21,pxVar16);
                    }
                  }
LAB_0015499b:
                  (*xmlFree)(pxVar16);
                }
              }
            }
            else {
              xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
              (*xmlFree)(pxVar16);
              pxVar17 = (xmlEntityPtr)0x0;
              str = (xmlChar *)pxVar19;
            }
          }
          else {
            pxVar17 = (xmlEntityPtr)0x0;
            local_58 = (xmlBufferPtr)str;
          }
          xmlParserEntityCheck(ctxt,0,pxVar17,0);
          if (pxVar17 != (xmlEntityPtr)0x0) {
            ctxt->nbentities = ctxt->nbentities + (long)(pxVar17->checked / 2);
            pbVar22 = pxVar17->content;
            if (pxVar17->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
              if (pbVar22 == (byte *)0x0) {
                xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,"predefined entity has no content\n");
                goto LAB_00154c7b;
              }
              iVar10 = xmlCopyCharMultiByte(pxVar12 + sVar26,(uint)*pbVar22);
              sVar25 = sVar26 + (long)iVar10;
              if ((local_60 < (long)iVar10 + sVar26 + 100) &&
                 ((uVar27 = local_60 * 2 + 100, uVar27 < local_60 ||
                  (pxVar18 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar27), local_60 = uVar27,
                  pxVar18 == (xmlChar *)0x0)))) {
                pxVar16 = (xmlChar *)0x0;
                goto LAB_00154c1f;
              }
            }
            else {
              local_50 = (xmlBufferPtr)str;
              if (pbVar22 == (byte *)0x0) {
                iVar10 = xmlStrlen(pxVar17->name);
                pxVar16 = pxVar17->name;
                pxVar12[sVar26] = '&';
                if ((local_60 < sVar26 + (long)iVar10 + 0x65) &&
                   ((uVar27 = (long)iVar10 + local_60 * 2 + 100, uVar27 < local_60 ||
                    (pxVar18 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar27), local_60 = uVar27,
                    pxVar18 == (xmlChar *)0x0)))) {
                  pxVar16 = (xmlChar *)0x0;
                  goto LAB_00154c1f;
                }
                sVar25 = sVar26 + 2;
                for (; 0 < iVar10; iVar10 = iVar10 + -1) {
                  xVar2 = *pxVar16;
                  pxVar16 = pxVar16 + 1;
                  pxVar18[sVar25 - 1] = xVar2;
                  sVar25 = sVar25 + 1;
                }
                pxVar18[sVar25 - 1] = ';';
                str = (xmlChar *)local_50;
              }
              else {
                ctxt->depth = ctxt->depth + 1;
                pxVar20 = (xmlChar *)0x0;
                pxVar16 = xmlStringDecodeEntities(ctxt,pbVar22,local_48,'\0','\0','\0');
                ctxt->depth = ctxt->depth + -1;
                pxVar18 = pxVar16;
                pxVar23 = pxVar12;
                if (pxVar16 == (xmlChar *)0x0) {
                  pxVar20 = pxVar17->content;
                  goto LAB_00154d16;
                }
                while (pxVar12 = pxVar23, *pxVar18 != '\0') {
                  pxVar23 = pxVar18 + 1;
                  sVar25 = sVar26 + 1;
                  pxVar12[sVar26] = *pxVar18;
                  uVar27 = sVar26 + 0x65;
                  pxVar18 = pxVar23;
                  sVar26 = sVar25;
                  pxVar23 = pxVar12;
                  if (local_60 < uVar27) {
                    iVar10 = xmlParserEntityCheck(ctxt,sVar25,pxVar17,0);
                    if (iVar10 != 0) goto LAB_00154c29;
                    uVar27 = local_60 * 2 + 100;
                    if ((uVar27 < local_60) ||
                       (pxVar23 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar27), local_60 = uVar27,
                       pxVar23 == (xmlChar *)0x0)) goto LAB_00154c1f;
                  }
                }
                (*xmlFree)(pxVar16);
                str = (xmlChar *)local_50;
                sVar25 = sVar26;
                pxVar18 = pxVar12;
              }
            }
          }
        }
        else if (((local_48 & 2) == 0) || (uVar9 != 0x25)) {
LAB_00153fb3:
          if (l == 1) {
            pxVar12[sVar26] = (xmlChar)pxVar16;
            sVar25 = sVar26 + 1;
          }
          else {
            iVar10 = xmlCopyCharMultiByte(pxVar12 + sVar26,uVar9);
            sVar25 = sVar26 + (long)iVar10;
          }
          str = (xmlChar *)((long)&((xmlBufferPtr)str)->content + (long)l);
          if ((local_60 < sVar25 + 100) &&
             ((uVar27 = local_60 * 2 + 100, uVar27 < local_60 ||
              (pxVar18 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar27), local_60 = uVar27,
              pxVar18 == (xmlChar *)0x0)))) {
            pxVar16 = (xmlChar *)0x0;
            goto LAB_00154c1f;
          }
        }
        else {
          piVar13 = __xmlParserDebugEntities();
          if (*piVar13 != 0) {
            pp_Var14 = __xmlGenericError();
            p_Var5 = *pp_Var14;
            ppvVar15 = __xmlGenericErrorContext();
            (*p_Var5)(*ppvVar15,"String decoding PE Reference: %.30s\n",str);
          }
          if ((xmlBufferPtr)str == (xmlBufferPtr)0x0) {
            str = (xmlChar *)0x0;
            pxVar17 = (xmlEntityPtr)0x0;
          }
          else if (*(byte *)&((xmlBufferPtr)str)->content == 0x25) {
            local_58 = (xmlBufferPtr)((long)&((xmlBufferPtr)str)->content + 1);
            pxVar16 = xmlParseStringName(ctxt,(xmlChar **)&local_58);
            str = (xmlChar *)local_58;
            if (pxVar16 == (xmlChar *)0x0) {
              xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringPEReference: no name\n");
              str = (xmlChar *)local_58;
            }
            else if (*(byte *)&local_58->content == 0x3b) {
              str = (xmlChar *)((long)&local_58->content + 1);
              ctxt->nbentities = ctxt->nbentities + 1;
              local_58 = (xmlBufferPtr)str;
              if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
                 (p_Var4 = ctxt->sax->getParameterEntity, p_Var4 == (getParameterEntitySAXFunc)0x0))
              {
                pxVar17 = (xmlEntityPtr)0x0;
              }
              else {
                pxVar17 = (*p_Var4)(ctxt->userData,pxVar16);
              }
              if (ctxt->instate != XML_PARSER_EOF) {
                if (pxVar17 == (xmlEntityPtr)0x0) {
                  if ((ctxt->standalone == 1) ||
                     ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                    xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,
                                      "PEReference: %%%s; not found\n",pxVar16);
                  }
                  else {
                    xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",
                                  pxVar16,pxVar20);
                    ctxt->valid = 0;
                  }
                  xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                }
                else if ((pxVar17->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                         XML_INTERNAL_PARAMETER_ENTITY) {
                  xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"%%%s; is not a parameter entity\n",
                                pxVar16,pxVar20);
                }
                ctxt->hasPErefs = 1;
                (*xmlFree)(pxVar16);
                goto LAB_00154239;
              }
              (*xmlFree)(pxVar16);
            }
            else {
              xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
              (*xmlFree)(pxVar16);
            }
            pxVar17 = (xmlEntityPtr)0x0;
          }
          else {
            pxVar17 = (xmlEntityPtr)0x0;
            local_58 = (xmlBufferPtr)str;
          }
LAB_00154239:
          xmlParserEntityCheck(ctxt,0,pxVar17,0);
          if (pxVar17 != (xmlEntityPtr)0x0) {
            ctxt->nbentities = ctxt->nbentities + (long)(pxVar17->checked / 2);
            if (pxVar17->content == (xmlChar *)0x0) {
              if (((ctxt->options & 0x12) == 0) && (ctxt->validate == 0)) {
                xmlWarningMsg(ctxt,XML_ERR_ENTITY_PROCESSING,
                              "not validating will not read content for PE entity %s\n",
                              pxVar17->name,pxVar20);
              }
              else {
                if ((pxVar17->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
                   (pxVar17->etype == XML_EXTERNAL_PARAMETER_ENTITY)) {
                  piVar13 = __xmlParserDebugEntities();
                  if (*piVar13 != 0) {
                    pp_Var14 = __xmlGenericError();
                    p_Var5 = *pp_Var14;
                    ppvVar15 = __xmlGenericErrorContext();
                    (*p_Var5)(*ppvVar15,"Reading %s entity content input\n",pxVar17->name);
                  }
                  pxVar19 = xmlBufferCreate();
                  if (pxVar19 != (xmlBufferPtr)0x0) {
                    xmlBufferSetAllocationScheme(pxVar19,XML_BUFFER_ALLOC_DOUBLEIT);
                    input = xmlNewEntityInputStream(ctxt,pxVar17);
                    if (input == (xmlParserInputPtr)0x0) {
                      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent input error");
LAB_0015460a:
                      xmlBufferFree(pxVar19);
                    }
                    else {
                      iVar10 = xmlPushInput(ctxt,input);
                      if (iVar10 < 0) {
                        xmlBufferFree(pxVar19);
                        xmlFreeInputStream(input);
                      }
                      else {
                        local_50 = pxVar19;
                        if ((ctxt->progressive == 0) &&
                           ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                          xmlGROW(ctxt);
                        }
                        do {
                          uVar9 = xmlCurrentChar(ctxt,(int *)&local_58);
                          iVar10 = 0;
                          do {
                            pxVar6 = ctxt->input;
                            if (pxVar6 != input) {
                              if ((int)uVar9 < 0x100) {
                                if ((int)uVar9 < 0x20) {
LAB_0015479e:
                                  if ((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0))
                                  goto LAB_00154948;
                                }
                              }
                              else {
                                bVar28 = uVar9 - 0xe000 < 0x1ffe;
                                bVar29 = uVar9 - 0x10000 < 0x100000;
LAB_0015490d:
                                if (!(bool)(uVar9 < 0xd800 | bVar28) && !bVar29) {
LAB_00154948:
                                  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                                    "xmlLoadEntityContent: invalid char value %d\n",
                                                    uVar9);
                                  xmlBufferFree(local_50);
                                  goto LAB_00154651;
                                }
                              }
LAB_00154922:
                              pxVar17->content = local_50->content;
                              local_50->content = (xmlChar *)0x0;
                              xmlBufferFree(local_50);
                              goto LAB_00154651;
                            }
                            if (pxVar6->end <= pxVar6->cur) {
                              xmlPopInput(ctxt);
                              goto LAB_00154922;
                            }
                            if ((int)uVar9 < 0x100) {
                              if (((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0)) &&
                                 ((int)uVar9 < 0x20)) goto LAB_0015479e;
                            }
                            else if (0xfffff < uVar9 - 0x10000 &&
                                     (0x1ffd < uVar9 - 0xe000 && 0xd7ff < uVar9)) {
                              bVar29 = false;
                              bVar28 = false;
                              goto LAB_0015490d;
                            }
                            xmlBufferAdd(local_50,pxVar6->cur,(int)local_58);
                            if (iVar10 < 0x65) {
                              iVar10 = iVar10 + 1;
                            }
                            else {
                              if ((ctxt->progressive == 0) &&
                                 ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                                xmlGROW(ctxt);
                              }
                              iVar10 = 0;
                              pxVar19 = local_50;
                              if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015460a;
                            }
                            pxVar6 = ctxt->input;
                            if (*pxVar6->cur == '\n') {
                              pxVar6->line = pxVar6->line + 1;
                              pxVar6->col = 1;
                            }
                            else {
                              pxVar6->col = pxVar6->col + 1;
                            }
                            pxVar6->cur = pxVar6->cur + (int)local_58;
                            uVar9 = xmlCurrentChar(ctxt,(int *)&local_58);
                          } while (uVar9 != 0);
                          if ((ctxt->progressive == 0) &&
                             ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                            xmlGROW(ctxt);
                          }
                        } while (ctxt->instate != XML_PARSER_EOF);
                        xmlBufferFree(local_50);
                      }
                    }
                    goto LAB_00154651;
                  }
                }
                xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent parameter error");
              }
            }
LAB_00154651:
            ctxt->depth = ctxt->depth + 1;
            pxVar20 = (xmlChar *)0x0;
            pxVar16 = xmlStringDecodeEntities(ctxt,pxVar17->content,local_48,'\0','\0','\0');
            ctxt->depth = ctxt->depth + -1;
            pxVar18 = pxVar16;
            pxVar23 = pxVar12;
            if (pxVar16 == (xmlChar *)0x0) {
              pxVar20 = pxVar17->content;
              if (pxVar20 != (xmlChar *)0x0) {
LAB_00154d16:
                *pxVar20 = '\0';
              }
              goto LAB_00154c7b;
            }
            while (pxVar12 = pxVar23, *pxVar18 != '\0') {
              pxVar23 = pxVar18 + 1;
              sVar25 = sVar26 + 1;
              pxVar12[sVar26] = *pxVar18;
              uVar27 = sVar26 + 0x65;
              sVar26 = sVar25;
              pxVar18 = pxVar23;
              pxVar23 = pxVar12;
              if (local_60 < uVar27) {
                iVar10 = xmlParserEntityCheck(ctxt,sVar25,pxVar17,0);
                if (iVar10 != 0) goto LAB_00154c29;
                uVar27 = local_60 * 2 + 100;
                if ((uVar27 < local_60) ||
                   (pxVar23 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar27), local_60 = uVar27,
                   pxVar23 == (xmlChar *)0x0)) goto LAB_00154c1f;
              }
            }
            (*xmlFree)(pxVar16);
            sVar25 = sVar26;
            pxVar18 = pxVar12;
          }
        }
LAB_00154a71:
        pxVar16 = (xmlChar *)0x0;
        sVar26 = sVar25;
        pxVar12 = pxVar18;
        if (str < local_38) {
          uVar9 = xmlStringCurrentChar(ctxt,str,&l);
          pxVar16 = (xmlChar *)(ulong)uVar9;
        }
      } while( true );
    }
    pxVar12 = (xmlChar *)0x0;
LAB_00154c1f:
    xmlErrMemory(ctxt,(char *)0x0);
LAB_00154c29:
    if (pxVar16 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar16);
    }
LAB_00154c7b:
    if (pxVar12 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar12);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
		      int what, xmlChar end, xmlChar  end2, xmlChar end3) {
    xmlChar *buffer = NULL;
    size_t buffer_size = 0;
    size_t nbchars = 0;

    xmlChar *current = NULL;
    xmlChar *rep = NULL;
    const xmlChar *last;
    xmlEntityPtr ent;
    int c,l;

    if ((ctxt == NULL) || (str == NULL) || (len < 0))
	return(NULL);
    last = str + len;

    if (((ctxt->depth > 40) &&
         ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
	(ctxt->depth > 1024)) {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
	return(NULL);
    }

    /*
     * allocate a translation buffer.
     */
    buffer_size = XML_PARSER_BIG_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) goto mem_error;

    /*
     * OK loop until we reach one of the ending char or a size limit.
     * we are operating on already parsed values.
     */
    if (str < last)
	c = CUR_SCHAR(str, l);
    else
        c = 0;
    while ((c != 0) && (c != end) && /* non input consuming loop */
           (c != end2) && (c != end3) &&
           (ctxt->instate != XML_PARSER_EOF)) {

	if (c == 0) break;
        if ((c == '&') && (str[1] == '#')) {
	    int val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0)
                goto int_error;
	    COPY_BUF(0,buffer,nbchars,val);
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	} else if ((c == '&') && (what & XML_SUBSTITUTE_REF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding Entity Reference: %.30s\n",
			str);
	    ent = xmlParseStringEntityRef(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content != NULL) {
		    COPY_BUF(0,buffer,nbchars,ent->content[0]);
		    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
			growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
		    }
		} else {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    goto int_error;
		}
	    } else if ((ent != NULL) && (ent->content != NULL)) {
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL) {
                    ent->content[0] = 0;
                    goto int_error;
                }

                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    } else if (ent != NULL) {
		int i = xmlStrlen(ent->name);
		const xmlChar *cur = ent->name;

		buffer[nbchars++] = '&';
		if (nbchars + i + XML_PARSER_BUFFER_SIZE > buffer_size) {
		    growBuffer(buffer, i + XML_PARSER_BUFFER_SIZE);
		}
		for (;i > 0;i--)
		    buffer[nbchars++] = *cur++;
		buffer[nbchars++] = ';';
	    }
	} else if (c == '%' && (what & XML_SUBSTITUTE_PEREF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding PE Reference: %.30s\n", str);
	    ent = xmlParseStringPEReference(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if (ent != NULL) {
                if (ent->content == NULL) {
		    /*
		     * Note: external parsed entities will not be loaded,
		     * it is not required for a non-validating parser to
		     * complete external PEReferences coming from the
		     * internal subset
		     */
		    if (((ctxt->options & XML_PARSE_NOENT) != 0) ||
			((ctxt->options & XML_PARSE_DTDVALID) != 0) ||
			(ctxt->validate != 0)) {
			xmlLoadEntityContent(ctxt, ent);
		    } else {
			xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
		  "not validating will not read content for PE entity %s\n",
		                      ent->name, NULL);
		    }
		}
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL) {
                    if (ent->content != NULL)
                        ent->content[0] = 0;
                    goto int_error;
                }
                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    }
	} else {
	    COPY_BUF(l,buffer,nbchars,c);
	    str += l;
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	}
	if (str < last)
	    c = CUR_SCHAR(str, l);
	else
	    c = 0;
    }
    buffer[nbchars] = 0;
    return(buffer);

mem_error:
    xmlErrMemory(ctxt, NULL);
int_error:
    if (rep != NULL)
        xmlFree(rep);
    if (buffer != NULL)
        xmlFree(buffer);
    return(NULL);
}